

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_rectfill_fp32x4(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  ulong uVar1;
  QRgbaFloat<float> color_00;
  int iVar2;
  QRgbaFloat<float> *dest;
  long count;
  long in_FS_OFFSET;
  QRgbaFloat<float> color_01;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  float fStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  fStack_3c = -NAN;
  (*qStoreFromRGBA64PM[rasterBuffer->format])
            ((uchar *)&local_48,color,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  color_01.g = (float)uStack_44;
  color_01.r = (float)local_48;
  color_01.a = fStack_3c;
  color_01.b = (float)uStack_40;
  color_00.g = (float)uStack_44;
  color_00.r = (float)local_48;
  color_00.b = (float)uStack_40;
  color_00.a = fStack_3c;
  uVar1 = rasterBuffer->bytes_per_line;
  dest = (QRgbaFloat<float> *)(rasterBuffer->m_buffer + (long)y * uVar1 + (long)x * 0x10);
  count = (long)width;
  if ((uVar1 & 0xffffffff) == count << 4) {
    qt_memfill_template<QRgbaFloat<float>>(dest,color_00,height * count);
  }
  else {
    iVar2 = 0;
    if (0 < height) {
      iVar2 = height;
    }
    while (iVar2 != 0) {
      qt_memfill_template<QRgbaFloat<float>>(dest,color_01,count);
      dest = (QRgbaFloat<float> *)((long)&dest->r + uVar1);
      iVar2 = iVar2 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_rectfill_fp32x4(QRasterBuffer *rasterBuffer,
                               int x, int y, int width, int height,
                               const QRgba64 &color)
{
    const auto store = qStoreFromRGBA64PM[rasterBuffer->format];
    QRgbaFloat32 c;
    store(reinterpret_cast<uchar *>(&c), &color, 0, 1, nullptr, nullptr);
    qt_rectfill<QRgbaFloat32>(reinterpret_cast<QRgbaFloat32 *>(rasterBuffer->buffer()),
                          c, x, y, width, height, rasterBuffer->bytesPerLine());
}